

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

bool __thiscall MutableS2ShapeIndex::Iterator::Prev(Iterator *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator local_28;
  Iterator *local_18;
  Iterator *this_local;
  
  local_18 = this;
  cVar2 = gtl::internal_btree::
          btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
          ::begin((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                   *)&this->index_->cell_map_);
  local_28.node = cVar2.node;
  local_28.position = cVar2.position;
  bVar1 = gtl::internal_btree::
          btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
          ::operator==(&this->iter_,&local_28);
  if (!bVar1) {
    gtl::internal_btree::
    btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
    ::operator--(&this->iter_);
    Refresh(this);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool MutableS2ShapeIndex::Iterator::Prev() {
  if (iter_ == index_->cell_map_.begin()) return false;
  --iter_;
  Refresh();
  return true;
}